

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O2

int __thiscall
glcts::TessellationShaderBarrierTests::init(TessellationShaderBarrierTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TessellationShaderBarrier1 *this_00;
  TessellationShaderBarrier2 *this_01;
  TessellationShaderBarrier3 *this_02;
  
  this_00 = (TessellationShaderBarrier1 *)operator_new(0x2d8);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TessellationShaderBarrier1::TessellationShaderBarrier1
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TessellationShaderBarrier2 *)operator_new(0x2d8);
  TessellationShaderBarrier2::TessellationShaderBarrier2
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TessellationShaderBarrier3 *)operator_new(0x2e8);
  TessellationShaderBarrier3::TessellationShaderBarrier3
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  return extraout_EAX;
}

Assistant:

void TessellationShaderBarrierTests::init(void)
{
	addChild(new glcts::TessellationShaderBarrier1(m_context, m_extParams));
	addChild(new glcts::TessellationShaderBarrier2(m_context, m_extParams));
	addChild(new glcts::TessellationShaderBarrier3(m_context, m_extParams));
}